

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O3

_Bool is_block_terminated(BasicBlock *block)

{
  Instruction *pIVar1;
  
  pIVar1 = raviX_last_instruction(block);
  if (pIVar1 != (Instruction *)0x0) {
    if (*(byte *)pIVar1 - 0x48 < 2) {
      return true;
    }
    if (*(byte *)pIVar1 == 1) {
      return true;
    }
  }
  return false;
}

Assistant:

static bool is_block_terminated(BasicBlock *block)
{
	Instruction *last_insn = raviX_last_instruction(block);
	if (last_insn == NULL)
		return false;
	if (last_insn->opcode == op_ret || last_insn->opcode == op_cbr || last_insn->opcode == op_br)
		return true;
	return false;
}